

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fffrow(fitsfile *fptr,char *expr,long firstrow,long nrows,long *n_good_rows,char *row_status,
          int *status)

{
  undefined1 uVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long *in_R8;
  long in_R9;
  int *in_stack_00000008;
  ParseData lParse;
  char result;
  long elem;
  long naxes [5];
  long nelem;
  int constant;
  int naxis;
  parseInfo Info;
  ParseData *lParse_00;
  long local_208;
  undefined1 local_200 [56];
  long local_1c8;
  int local_1b8;
  long *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  fitsfile *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffea0;
  long *in_stack_fffffffffffffea8;
  ParseData *in_stack_fffffffffffffeb0;
  int *in_stack_fffffffffffffeb8;
  long local_110;
  undefined1 local_108 [200];
  long local_40;
  long *local_38;
  long local_30;
  long local_28;
  int local_c;
  
  if (*in_stack_00000008 == 0) {
    local_40 = in_R9;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    memset(local_108 + 0x38,0,0x90);
    lParse_00 = (ParseData *)local_108;
    iVar2 = ffiprs(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeb8);
    if (iVar2 == 0) {
      local_108[0x30] = (long)local_108._40_8_ < 0;
      if ((bool)local_108[0x30]) {
        local_108._40_8_ = -local_108._40_8_;
      }
      local_108._49_3_ = 0;
      if ((local_108._56_4_ == 0xe) && ((char *)local_108._40_8_ == (char *)0x1)) {
        if (local_108._48_4_ == 0) {
          if (local_28 < 2) {
            local_208 = 1;
          }
          else {
            local_208 = local_28;
          }
          local_28 = local_208;
          local_108._64_8_ = local_40;
          local_108._72_8_ = 0;
          local_108._80_8_ = local_30;
          local_108._96_8_ = local_200;
          iVar2 = ffiter((int)lParse.nDataRows,(iteratorCol *)lParse.firstDataRow,
                         (long)lParse.pixFilter,(long)lParse.varData,
                         (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
                         lParse.colData,(void *)lParse.nAxes[4],(int *)lParse._216_8_);
          if (iVar2 == -1) {
            *in_stack_00000008 = 0;
          }
          if (*in_stack_00000008 == 0) {
            *local_38 = 0;
            for (local_110 = 0; local_110 < (long)local_108._80_8_; local_110 = local_110 + 1) {
              if (*(char *)(local_40 + local_110) == '\x01') {
                *local_38 = *local_38 + 1;
              }
            }
          }
        }
        else {
          uVar1 = *(undefined1 *)(local_1c8 + (long)local_1b8 * 0x180 + 0x80);
          *local_38 = local_30;
          for (local_110 = 0; local_110 < local_30; local_110 = local_110 + 1) {
            *(undefined1 *)(local_40 + local_110) = uVar1;
          }
        }
        ffcprs(lParse_00);
        local_c = *in_stack_00000008;
      }
      else {
        ffcprs(lParse_00);
        ffpmsg((char *)0x139438);
        *in_stack_00000008 = 0x1b0;
        local_c = 0x1b0;
      }
    }
    else {
      ffcprs(lParse_00);
      local_c = *in_stack_00000008;
    }
  }
  else {
    local_c = *in_stack_00000008;
  }
  return local_c;
}

Assistant:

int fffrow( fitsfile *fptr,         /* I - Input FITS file                   */
            char     *expr,         /* I - Boolean expression                */
            long     firstrow,      /* I - First row of table to eval        */
            long     nrows,         /* I - Number of rows to evaluate        */
            long     *n_good_rows,  /* O - Number of rows eval to True       */
            char     *row_status,   /* O - Array of boolean results          */
            int      *status )      /* O - Error status                      */
/*                                                                           */
/* Evaluate a boolean expression using the indicated rows, returning an      */
/* array of flags indicating which rows evaluated to TRUE/FALSE              */
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );
   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   if( constant ) { /* No need to call parser... have result from ffiprs */
      result = lParse.Nodes[lParse.resultNode].value.data.log;
      *n_good_rows = nrows;
      for( elem=0; elem<nrows; elem++ )
         row_status[elem] = result;
   } else {
      firstrow     = (firstrow>1 ? firstrow : 1);
      Info.dataPtr = row_status;
      Info.nullPtr = NULL;
      Info.maxRows = nrows;
      Info.parseData = &lParse;

      if( ffiter( lParse.nCols, lParse.colData, firstrow-1, 0,
                  fits_parser_workfn, (void*)&Info, status ) == -1 )
         *status = 0;  /* -1 indicates exitted without error before end... OK */

      if( *status ) {

         /***********************/
         /* Error... Do nothing */
         /***********************/

      } else {

         /***********************************/
         /* Count number of good rows found */
         /***********************************/

         *n_good_rows = 0L;
         for( elem=0; elem<Info.maxRows; elem++ ) {
            if( row_status[elem]==1 ) ++*n_good_rows;
         }
      }
   }

   ffcprs(&lParse);
   return(*status);
}